

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_service_null(t_cpp_generator *this,t_service *tservice,string *style)

{
  string *psVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  int *piVar3;
  t_function *tfunction;
  t_type *type;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  pointer pptVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string local_230;
  string local_210;
  string local_1f0;
  t_field returnfield;
  string local_120;
  t_field returnfield_1;
  string local_50;
  
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&returnfield);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_288,this,&tservice->extends_->super_t_type,false,false);
    std::operator+(&local_2a8," , virtual public ",&local_288);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &returnfield_1,&local_2a8,style);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&returnfield
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &returnfield_1,"Null");
    std::__cxx11::string::operator=((string *)&extends,(string *)&returnfield);
    std::__cxx11::string::~string((string *)&returnfield);
    std::__cxx11::string::~string((string *)&returnfield_1);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_288);
  }
  poVar2 = &this->f_header_;
  poVar6 = std::operator<<((ostream *)poVar2,"class ");
  psVar1 = &(this->super_t_oop_generator).super_t_generator.service_name_;
  poVar6 = std::operator<<(poVar6,(string *)psVar1);
  poVar6 = std::operator<<(poVar6,(string *)style);
  poVar6 = std::operator<<(poVar6,"Null : virtual public ");
  poVar6 = std::operator<<(poVar6,(string *)psVar1);
  poVar6 = std::operator<<(poVar6,(string *)style);
  poVar6 = std::operator<<(poVar6,"If");
  poVar6 = std::operator<<(poVar6,(string *)&extends);
  poVar6 = std::operator<<(poVar6," {");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6," public:");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar3 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar3 = *piVar3 + 1;
  t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar2,(string *)&returnfield);
  poVar6 = std::operator<<(poVar6,"virtual ~");
  poVar6 = std::operator<<(poVar6,(string *)psVar1);
  poVar6 = std::operator<<(poVar6,(string *)style);
  poVar6 = std::operator<<(poVar6,"Null() {}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&returnfield);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  pptVar8 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar8 ==
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      piVar3 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar3 = *piVar3 + -1;
      poVar6 = std::operator<<((ostream *)poVar2,"};");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
                (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
      std::__cxx11::string::~string((string *)&extends);
      return;
    }
    t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar2,(string *)&returnfield);
    tfunction = *pptVar8;
    std::__cxx11::string::string((string *)&local_230,(string *)style);
    std::__cxx11::string::string((string *)&local_1f0,"",(allocator *)&local_2a8);
    function_signature((string *)&returnfield_1,this,tfunction,&local_230,&local_1f0,false);
    poVar6 = std::operator<<(poVar6,(string *)&returnfield_1);
    poVar6 = std::operator<<(poVar6," override {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&returnfield_1);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&returnfield);
    piVar3 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar3 = *piVar3 + 1;
    type = (*pptVar8)->returntype_;
    std::__cxx11::string::string((string *)&local_50,"_return",(allocator *)&returnfield_1);
    t_field::t_field(&returnfield,type,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar4 = std::operator==(style,"");
    if (bVar4) {
      iVar5 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
      if ((char)iVar5 == '\0') {
        bVar4 = is_complex_type(this,type);
        if (!bVar4) {
          t_generator::indent_abi_cxx11_((string *)&returnfield_1,(t_generator *)this);
          poVar6 = std::operator<<((ostream *)poVar2,(string *)&returnfield_1);
          declare_field_abi_cxx11_(&local_2a8,this,&returnfield,true,false,false,false);
          poVar6 = std::operator<<(poVar6,(string *)&local_2a8);
          poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
          poVar6 = std::operator<<(poVar6,(string *)&local_288);
          poVar6 = std::operator<<(poVar6,"return _return;");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          goto LAB_001764b6;
        }
      }
      t_generator::indent_abi_cxx11_((string *)&returnfield_1,(t_generator *)this);
      poVar6 = std::operator<<((ostream *)poVar2,(string *)&returnfield_1);
      poVar6 = std::operator<<(poVar6,"return;");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
LAB_001764b6:
      std::__cxx11::string::~string((string *)&returnfield_1);
    }
    else {
      bVar4 = std::operator==(style,"CobSv");
      if (!bVar4) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "UNKNOWN STYLE";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      iVar5 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
      if ((char)iVar5 != '\0') {
        t_generator::indent_abi_cxx11_((string *)&returnfield_1,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)poVar2,(string *)&returnfield_1);
        poVar6 = std::operator<<(poVar6,"return cob();");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        goto LAB_001764b6;
      }
      std::__cxx11::string::string((string *)&local_120,"_return",(allocator *)&local_2a8);
      t_field::t_field(&returnfield_1,type,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
      poVar6 = std::operator<<((ostream *)poVar2,(string *)&local_2a8);
      declare_field_abi_cxx11_(&local_288,this,&returnfield_1,true,false,false,false);
      poVar6 = std::operator<<(poVar6,(string *)&local_288);
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_210);
      poVar6 = std::operator<<(poVar6,"return cob(_return);");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      t_field::~t_field(&returnfield_1);
    }
    piVar3 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar3 = *piVar3 + -1;
    t_generator::indent_abi_cxx11_((string *)&returnfield_1,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar2,(string *)&returnfield_1);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&returnfield_1);
    t_field::~t_field(&returnfield);
    pptVar8 = pptVar8 + 1;
  } while( true );
}

Assistant:

void t_cpp_generator::generate_service_null(t_service* tservice, string style) {
  string extends = "";
  if (tservice->get_extends() != nullptr) {
    extends = " , virtual public " + type_name(tservice->get_extends()) + style + "Null";
  }
  f_header_ << "class " << service_name_ << style << "Null : virtual public " << service_name_
            << style << "If" << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "virtual ~" << service_name_ << style << "Null() {}" << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_header_ << indent() << function_signature(*f_iter, style, "", false)
              << " override {" << endl;
    indent_up();

    t_type* returntype = (*f_iter)->get_returntype();
    t_field returnfield(returntype, "_return");

    if (style == "") {
      if (returntype->is_void() || is_complex_type(returntype)) {
        f_header_ << indent() << "return;" << endl;
      } else {
        f_header_ << indent() << declare_field(&returnfield, true) << endl << indent()
                  << "return _return;" << endl;
      }
    } else if (style == "CobSv") {
      if (returntype->is_void()) {
        f_header_ << indent() << "return cob();" << endl;
      } else {
        t_field returnfield(returntype, "_return");
        f_header_ << indent() << declare_field(&returnfield, true) << endl << indent()
                  << "return cob(_return);" << endl;
      }

    } else {
      throw "UNKNOWN STYLE";
    }

    indent_down();
    f_header_ << indent() << "}" << endl;
  }
  indent_down();
  f_header_ << "};" << endl << endl;
}